

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O2

void __thiscall GOESNImageHandler::handle(GOESNImageHandler *this,shared_ptr<const_lrit::File> *f)

{
  GOESNImageHandler *pGVar1;
  GOESNImageHandler *pGVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer psVar5;
  bool bVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  mapped_type *this_00;
  long lVar8;
  GOESNImageHandler *pGVar9;
  __normal_iterator<std::shared_ptr<const_lrit::File>_*,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>
  _Var10;
  iterator end;
  long lVar11;
  __normal_iterator<std::shared_ptr<const_lrit::File>_*,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>
  __it;
  unique_ptr<Image,_std::default_delete<Image>_> image;
  value_type first;
  Timer t_1;
  NOAALRITHeader nlh;
  string text;
  string path;
  Details db;
  string filename;
  SegmentIdentificationHeader sih;
  Channel channel;
  Region region;
  Details details;
  tuple<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key;
  PrimaryHeader ph;
  Details da;
  undefined1 local_528 [16];
  __shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> local_518;
  Timer local_508;
  __shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2> local_500;
  NOAALRITHeader local_4f0;
  undefined1 local_4e0 [56];
  undefined1 local_4a8 [96];
  undefined1 local_448 [96];
  string local_3e8;
  string local_3c8;
  SegmentIdentificationHeader local_3a2;
  Channel local_390;
  Region local_350;
  undefined1 local_310 [48];
  _Tuple_impl<0UL,_const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  PrimaryHeader local_298;
  undefined1 local_280 [8];
  _Alloc_hider local_278;
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_260 [2];
  undefined8 local_240;
  pointer pMStack_238;
  Region local_b0;
  Channel local_70;
  
  pGVar9 = (GOESNImageHandler *)
           (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lrit::File::getHeader<lrit::PrimaryHeader>(&local_298,(File *)pGVar9);
  if (local_298.fileType != '\0') {
    return;
  }
  local_4f0 = lrit::File::getHeader<lrit::NOAALRITHeader>
                        ((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
  if (this->productID_ != local_4f0.productID) {
    return;
  }
  loadRegion(&local_350,pGVar9,&local_4f0);
  pGVar1 = (GOESNImageHandler *)
           (this->config_).regions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar2 = (GOESNImageHandler *)
           (this->config_).regions.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((pGVar1 != pGVar2) &&
     (pGVar9 = pGVar2,
     _Var7 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pGVar1,pGVar2,&local_350), (GOESNImageHandler *)_Var7._M_current == pGVar2))
  goto LAB_00186f08;
  loadChannel(&local_390,pGVar9,&local_4f0);
  pbVar3 = (this->config_).channels.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->config_).channels.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pbVar3 == pbVar4) ||
      (_Var7 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         (pbVar3,pbVar4,&local_390), _Var7._M_current != pbVar4)) &&
     (bVar6 = lrit::hasHeader<lrit::SegmentIdentificationHeader>
                        (&((f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->m_), bVar6)) {
    lrit::File::getHeader<lrit::SegmentIdentificationHeader>
              (&local_3a2,
               (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    std::_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<std::__cxx11::string&,std::__cxx11::string&,void>
              ((_Tuple_impl<1ul,std::__cxx11::string,std::__cxx11::string> *)&local_2e0,
               &local_350.nameShort,&local_390.nameShort);
    local_2e0.super__Head_base<0UL,_const_char_*,_false>._M_head_impl = "unused";
    std::_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>::
    _Tuple_impl<char_const*,std::__cxx11::string,std::__cxx11::string>
              ((_Tuple_impl<0ul,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string> *)
               local_280,&local_2e0);
    pGVar9 = (GOESNImageHandler *)local_280;
    this_00 = std::__detail::
              _Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_SegmentKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->segments_,(key_type *)pGVar9);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_280);
    psVar5 = (this_00->
             super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (psVar5 != (this_00->
                  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      loadDetails((Details *)local_280,pGVar9,
                  (f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      loadDetails((Details *)local_448,pGVar9,
                  (psVar5->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
      ;
      if (local_280 != (undefined1  [8])local_448._0_8_) {
        std::
        vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
        ::clear(this_00);
      }
      std::__cxx11::string::~string((string *)(local_448 + 0x10));
      std::__cxx11::string::~string((string *)local_270);
    }
    std::__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_500,&f->super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>);
    lrit::File::getHeader<lrit::SegmentIdentificationHeader>
              ((SegmentIdentificationHeader *)local_280,local_500._M_ptr);
    __it._M_current =
         (this_00->
         super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_528._8_8_ =
         (this_00->
         super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = local_528._8_8_ - (long)__it._M_current;
    local_448._0_8_ = (SegmentIdentificationHeader *)local_280;
    for (lVar8 = lVar11 >> 6; _Var10._M_current = __it._M_current, 0 < lVar8; lVar8 = lVar8 + -1) {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,__it);
      if (bVar6) goto LAB_00186bf0;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,__it._M_current + 1);
      _Var10._M_current = __it._M_current + 1;
      if (bVar6) goto LAB_00186bf0;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,__it._M_current + 2);
      _Var10._M_current = __it._M_current + 2;
      if (bVar6) goto LAB_00186bf0;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,__it._M_current + 3);
      _Var10._M_current = __it._M_current + 3;
      if (bVar6) goto LAB_00186bf0;
      __it._M_current = __it._M_current + 4;
      lVar11 = lVar11 + -0x40;
    }
    lVar11 = lVar11 >> 4;
    if (lVar11 == 1) {
LAB_00186f2b:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,__it);
      _Var10._M_current = (shared_ptr<const_lrit::File> *)local_528._8_8_;
      if (bVar6) {
        _Var10._M_current = __it._M_current;
      }
    }
    else if (lVar11 == 2) {
LAB_00186bbf:
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
              ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                            *)local_448,_Var10);
      if (!bVar6) {
        __it._M_current = _Var10._M_current + 1;
        goto LAB_00186f2b;
      }
    }
    else {
      _Var10._M_current = (shared_ptr<const_lrit::File> *)local_528._8_8_;
      if ((lVar11 == 3) &&
         (bVar6 = __gnu_cxx::__ops::
                  _Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::$_0>
                  ::operator()((_Iter_pred<(anonymous_namespace)::insertSegment(std::vector<std::shared_ptr<lrit::File_const>,std::allocator<std::shared_ptr<lrit::File_const>>>&,std::shared_ptr<lrit::File_const>)::__0>
                                *)local_448,__it), _Var10._M_current = __it._M_current, !bVar6)) {
        _Var10._M_current = __it._M_current + 1;
        goto LAB_00186bbf;
      }
    }
LAB_00186bf0:
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    insert(this_00,(const_iterator)_Var10._M_current,(value_type *)&local_500);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500._M_refcount);
    if ((long)(this_00->
              super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(this_00->
              super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
              )._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)local_3a2.maxSegment) {
      Timer::Timer(&local_508);
      std::__shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_518,
                 &((this_00->
                   super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>);
      std::
      vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ::vector((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                *)(local_4e0 + 0x20),this_00);
      Image::createFromFiles
                ((Image *)local_528,
                 (vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                  *)(local_4e0 + 0x20));
      std::
      vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ::~vector((vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                 *)(local_4e0 + 0x20));
      std::
      vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
      ::clear(this_00);
      lrit::File::getHeader<lrit::AnnotationHeader>((AnnotationHeader *)local_280,local_518._M_ptr);
      local_4e0._0_8_ = local_4e0 + 0x10;
      if (local_278._M_p == local_270 + 8) {
        local_4e0._24_8_ = aaStack_260[0]._0_8_;
      }
      else {
        local_4e0._0_8_ = local_278._M_p;
      }
      pGVar9 = (GOESNImageHandler *)local_4e0;
      local_4e0._8_8_ = local_270._0_8_;
      local_270._0_8_ = 0;
      local_270[8] = '\0';
      local_278._M_p = local_270 + 8;
      std::__cxx11::string::~string((string *)&local_278);
      removeSuffix(&local_3c8,(string *)pGVar9);
      loadDetails((Details *)local_310,pGVar9,local_518._M_ptr);
      FilenameBuilder::FilenameBuilder((FilenameBuilder *)local_280);
      std::__cxx11::string::_M_assign((string *)local_280);
      std::__cxx11::string::_M_assign((string *)aaStack_260[0]._M_local_buf);
      local_240 = local_310._0_8_;
      pMStack_238 = (pointer)local_310._8_8_;
      Region::operator=(&local_b0,&local_350);
      Channel::operator=(&local_70,&local_390);
      cv::Mat::Mat((Mat *)local_448);
      if (((this->config_).crop.maxColumn == (this->config_).crop.minColumn) &&
         ((this->config_).crop.maxLine == (this->config_).crop.minLine)) {
        Image::getScaledImage((Image *)local_4a8,SUB81(local_528._0_8_,0));
        cv::Mat::operator=((Mat *)local_448,(Mat *)local_4a8);
      }
      else {
        Image::getScaledImage((Image *)local_4a8,(Area *)local_528._0_8_,(bool)((char)this + -0x2c))
        ;
        cv::Mat::operator=((Mat *)local_448,(Mat *)local_4a8);
      }
      cv::Mat::~Mat((Mat *)local_4a8);
      std::__cxx11::string::string((string *)&local_3e8,(string *)&(this->config_).format);
      FilenameBuilder::build
                ((string *)local_4a8,(FilenameBuilder *)local_280,&(this->config_).filename,
                 &local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      FileWriter::write((this->fileWriter_).
                        super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        (int)local_4a8,local_448,(size_t)&local_508);
      if ((this->config_).json == true) {
        FileWriter::writeHeader
                  ((this->fileWriter_).super___shared_ptr<FileWriter,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,local_518._M_ptr,(string *)local_4a8);
      }
      std::__cxx11::string::~string((string *)local_4a8);
      cv::Mat::~Mat((Mat *)local_448);
      FilenameBuilder::~FilenameBuilder((FilenameBuilder *)local_280);
      std::__cxx11::string::~string((string *)(local_310 + 0x10));
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)local_4e0);
      std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
                ((unique_ptr<Image,_std::default_delete<Image>_> *)local_528);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_518._M_refcount);
    }
    std::
    _Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl(&local_2e0.
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
  }
  Channel::~Channel(&local_390);
LAB_00186f08:
  Region::~Region(&local_350);
  return;
}

Assistant:

void GOESNImageHandler::handle(std::shared_ptr<const lrit::File> f) {
  auto ph = f->getHeader<lrit::PrimaryHeader>();
  if (ph.fileType != 0) {
    return;
  }

  // Filter by product
  auto nlh = f->getHeader<lrit::NOAALRITHeader>();
  if (nlh.productID != productID_) {
    return;
  }

  // Filter by region
  auto region = loadRegion(nlh);
  if (!config_.regions.empty()) {
    auto begin = std::begin(config_.regions);
    auto end = std::end(config_.regions);
    auto it = std::find(begin, end, region.nameShort);
    if (it == end) {
      return;
    }
  }

  // Filter by channel
  auto channel = loadChannel(nlh);
  if (!config_.channels.empty()) {
    auto begin = std::begin(config_.channels);
    auto end = std::end(config_.channels);
    auto it = std::find(begin, end, channel.nameShort);
    if (it == end) {
      return;
    }
  }

  // Assume all images are segmented
  if (!f->hasHeader<lrit::SegmentIdentificationHeader>()) {
    return;
  }

  auto sih = f->getHeader<lrit::SegmentIdentificationHeader>();
  auto key = std::make_tuple("unused", region.nameShort, channel.nameShort);
  auto& vector = segments_[key];

  // Ensure we can append this segment
  if (!vector.empty()) {
    const auto& t = vector.front();

    // Use "Time of frame start" field in ancillary text header to
    // check that this segment belongs to the set of existing ones.
    // Previously this was done with the segment identification
    // header, but a ground station update in August 2018 introduced
    // an error where segments of the same image often don't share the
    // same image identification header. This is only the case for the
    // GOES-16 (possibly also GOES-17) relay of GOES-15 on HRIT.
    auto da = loadDetails(*f);
    auto db = loadDetails(*t);
    if (da.frameStart.tv_sec != db.frameStart.tv_sec) {
      vector.clear();
    }
  }

  insertSegment(vector, f);
  if (vector.size() == sih.maxSegment) {
    Timer t;

    auto first = vector.front();
    auto image = Image::createFromFiles(vector);
    vector.clear();

    auto text = first->getHeader<lrit::AnnotationHeader>().text;
    auto filename = removeSuffix(text);
    auto details = loadDetails(*first);

    FilenameBuilder fb;
    fb.dir = config_.dir;
    fb.filename = filename;
    fb.time = details.frameStart;
    fb.region = region;
    fb.channel = channel;

    cv::Mat raw;
    if (config_.crop.empty()) {
      raw = image->getScaledImage(false);
    } else {
      raw = image->getScaledImage(config_.crop, false);
    }

    overlayMaps(*first, config_.crop, raw);
    auto path = fb.build(config_.filename, config_.format);
    fileWriter_->write(path, raw, &t);
    if (config_.json) {
      fileWriter_->writeHeader(*first, path);
    }
    return;
  }
}